

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem.c
# Opt level: O3

int nn_sem_wait(nn_sem *self)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = sem_wait((sem_t *)self);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      return -4;
    }
  }
  else {
    if (iVar1 == 0) {
      return 0;
    }
    __errno_location();
  }
  nn_sem_wait_cold_1();
  return -4;
}

Assistant:

int nn_sem_wait (struct nn_sem *self)
{
    int rc;

    rc = sem_wait (&self->sem);
    if (nn_slow (rc < 0 && errno == EINTR))
        return -EINTR;
    errno_assert (rc == 0);
    return 0;
}